

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

StructNew * __thiscall
wasm::Builder::makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,HeapType type,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args)

{
  Module *pMVar1;
  StructNew *pSVar2;
  Type local_30;
  
  pMVar1 = this->wasm;
  pSVar2 = (StructNew *)MixedArena::allocSpace((MixedArena *)(pMVar1 + 0x158),0x30,8);
  (pSVar2->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression._id = StructNewId;
  (pSVar2->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id = 0;
  (pSVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
       = (Expression **)0x0;
  (pSVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pSVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pSVar2->operands).allocator = (MixedArena *)(pMVar1 + 0x158);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pSVar2->operands,
             args);
  wasm::Type::Type(&local_30,type,NonNullable);
  (pSVar2->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id =
       local_30.id;
  wasm::StructNew::finalize();
  return pSVar2;
}

Assistant:

StructNew* makeStructNew(HeapType type, const T& args) {
    auto* ret = wasm.allocator.alloc<StructNew>();
    ret->operands.set(args);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }